

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

LinkImplementation * __thiscall cmTarget::GetLinkImplementation(cmTarget *this,string *config)

{
  bool bVar1;
  cmTargetInternals *pcVar2;
  map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
  *this_00;
  cmTarget *local_60 [3];
  cmTarget *local_48;
  OptionalLinkImplementation *impl;
  string CONFIG;
  string *config_local;
  cmTarget *this_local;
  
  CONFIG.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmTarget *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&impl,(string *)CONFIG.field_2._8_8_);
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap>_>_>
               ::operator[](&pcVar2->LinkImplMap,(key_type *)&impl)->
               super_map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
    ;
    local_60[0] = this;
    local_48 = (cmTarget *)
               std::
               map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
               ::operator[](this_00,local_60);
    if (((ulong)(local_48->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left & 1) == 0) {
      *(undefined1 *)
       &(local_48->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           1;
      pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
      cmTargetInternals::ComputeLinkImplementationLibraries
                (pcVar2,this,(string *)CONFIG.field_2._8_8_,(OptionalLinkImplementation *)local_48,
                 this);
    }
    if (((ulong)(local_48->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left & 0x100) == 0) {
      *(undefined1 *)
       ((long)&(local_48->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left + 1) = 1;
      pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
      cmTargetInternals::ComputeLinkImplementationLanguages
                (pcVar2,this,(string *)CONFIG.field_2._8_8_,(OptionalLinkImplementation *)local_48);
    }
    this_local = local_48;
    std::__cxx11::string::~string((string *)&impl);
  }
  return (LinkImplementation *)this_local;
}

Assistant:

cmTarget::LinkImplementation const*
cmTarget::GetLinkImplementation(const std::string& config) const
{
  // There is no link implementation for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  // Populate the link implementation for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmTargetInternals::OptionalLinkImplementation&
    impl = this->Internal->LinkImplMap[CONFIG][this];
  if(!impl.LibrariesDone)
    {
    impl.LibrariesDone = true;
    this->Internal
      ->ComputeLinkImplementationLibraries(this, config, impl, this);
    }
  if(!impl.LanguagesDone)
    {
    impl.LanguagesDone = true;
    this->Internal->ComputeLinkImplementationLanguages(this, config, impl);
    }
  return &impl;
}